

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonschema::
compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
compilation_context(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *this,uri_wrapper *retrieval_uri,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *custom_messages)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  unsigned_long uVar5;
  initializer_list<jsoncons::jsonschema::uri_wrapper> __l;
  __alloc_node_gen_t __alloc_node_gen;
  allocator_type local_e9;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  unsigned_long local_c8;
  unsigned_long uStack_c0;
  unsigned_long local_b8;
  unsigned_long uStack_b0;
  unsigned_long local_a8;
  unsigned_long uStack_a0;
  unsigned_long local_98;
  unsigned_long uStack_90;
  unsigned_long local_88;
  unsigned_long uStack_80;
  unsigned_long local_78;
  unsigned_long uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  (this->base_uri_).uri_.uri_string_._M_dataplus._M_p =
       (pointer)&(this->base_uri_).uri_.uri_string_.field_2;
  pcVar1 = (retrieval_uri->uri_).uri_string_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (retrieval_uri->uri_).uri_string_._M_string_length);
  uVar5 = (retrieval_uri->uri_).scheme_part_.second;
  (this->base_uri_).uri_.scheme_part_.first = (retrieval_uri->uri_).scheme_part_.first;
  (this->base_uri_).uri_.scheme_part_.second = uVar5;
  uVar5 = (retrieval_uri->uri_).userinfo_part_.second;
  (this->base_uri_).uri_.userinfo_part_.first = (retrieval_uri->uri_).userinfo_part_.first;
  (this->base_uri_).uri_.userinfo_part_.second = uVar5;
  uVar5 = (retrieval_uri->uri_).host_part_.second;
  (this->base_uri_).uri_.host_part_.first = (retrieval_uri->uri_).host_part_.first;
  (this->base_uri_).uri_.host_part_.second = uVar5;
  uVar5 = (retrieval_uri->uri_).port_part_.second;
  (this->base_uri_).uri_.port_part_.first = (retrieval_uri->uri_).port_part_.first;
  (this->base_uri_).uri_.port_part_.second = uVar5;
  uVar5 = (retrieval_uri->uri_).path_part_.second;
  (this->base_uri_).uri_.path_part_.first = (retrieval_uri->uri_).path_part_.first;
  (this->base_uri_).uri_.path_part_.second = uVar5;
  uVar5 = (retrieval_uri->uri_).query_part_.second;
  (this->base_uri_).uri_.query_part_.first = (retrieval_uri->uri_).query_part_.first;
  (this->base_uri_).uri_.query_part_.second = uVar5;
  uVar2 = *(undefined4 *)((long)&(retrieval_uri->uri_).fragment_part_.first + 4);
  uVar5 = (retrieval_uri->uri_).fragment_part_.second;
  uVar3 = *(undefined4 *)((long)&(retrieval_uri->uri_).fragment_part_.second + 4);
  *(int *)&(this->base_uri_).uri_.fragment_part_.first =
       (int)(retrieval_uri->uri_).fragment_part_.first;
  *(undefined4 *)((long)&(this->base_uri_).uri_.fragment_part_.first + 4) = uVar2;
  *(int *)&(this->base_uri_).uri_.fragment_part_.second = (int)uVar5;
  *(undefined4 *)((long)&(this->base_uri_).uri_.fragment_part_.second + 4) = uVar3;
  (this->base_uri_).identifier_._M_dataplus._M_p = (pointer)&(this->base_uri_).identifier_.field_2;
  pcVar1 = (retrieval_uri->identifier_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->base_uri_).identifier_,pcVar1,
             pcVar1 + (retrieval_uri->identifier_)._M_string_length);
  (this->base_uri_).has_plain_name_fragment_ = retrieval_uri->has_plain_name_fragment_;
  pcVar1 = (retrieval_uri->uri_).uri_string_._M_dataplus._M_p;
  local_e8._0_8_ = (__hashtable_alloc *)(local_e8 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar1,pcVar1 + (retrieval_uri->uri_).uri_string_._M_string_length);
  local_c8 = (retrieval_uri->uri_).scheme_part_.first;
  uStack_c0 = (retrieval_uri->uri_).scheme_part_.second;
  local_b8 = (retrieval_uri->uri_).userinfo_part_.first;
  uStack_b0 = (retrieval_uri->uri_).userinfo_part_.second;
  local_a8 = (retrieval_uri->uri_).host_part_.first;
  uStack_a0 = (retrieval_uri->uri_).host_part_.second;
  local_98 = (retrieval_uri->uri_).port_part_.first;
  uStack_90 = (retrieval_uri->uri_).port_part_.second;
  local_88 = (retrieval_uri->uri_).path_part_.first;
  uStack_80 = (retrieval_uri->uri_).path_part_.second;
  local_78 = (retrieval_uri->uri_).query_part_.first;
  uStack_70 = (retrieval_uri->uri_).query_part_.second;
  local_68 = (undefined4)(retrieval_uri->uri_).fragment_part_.first;
  uStack_64 = *(undefined4 *)((long)&(retrieval_uri->uri_).fragment_part_.first + 4);
  uStack_60 = (undefined4)(retrieval_uri->uri_).fragment_part_.second;
  uStack_5c = *(undefined4 *)((long)&(retrieval_uri->uri_).fragment_part_.second + 4);
  pcVar1 = (retrieval_uri->identifier_)._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (retrieval_uri->identifier_)._M_string_length);
  local_38 = retrieval_uri->has_plain_name_fragment_;
  __l._M_len = 1;
  __l._M_array = (iterator)local_e8;
  std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  ::vector(&this->uris_,__l,&local_e9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((__hashtable_alloc *)local_e8._0_8_ != (__hashtable_alloc *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
  }
  (this->id_).super__Optional_base<jsoncons::uri,_false,_false>._M_payload.
  super__Optional_payload<jsoncons::uri,_true,_false,_false>.
  super__Optional_payload_base<jsoncons::uri>._M_engaged = false;
  local_e8._0_8_ = &this->custom_messages_;
  (this->custom_messages_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->custom_messages_)._M_h._M_bucket_count = (custom_messages->_M_h)._M_bucket_count;
  (this->custom_messages_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->custom_messages_)._M_h._M_element_count = (custom_messages->_M_h)._M_element_count;
  uVar2 = *(undefined4 *)&(custom_messages->_M_h)._M_rehash_policy.field_0x4;
  sVar4 = (custom_messages->_M_h)._M_rehash_policy._M_next_resize;
  (this->custom_messages_)._M_h._M_rehash_policy._M_max_load_factor =
       (custom_messages->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->custom_messages_)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->custom_messages_)._M_h._M_rehash_policy._M_next_resize = sVar4;
  (this->custom_messages_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_e8._0_8_,&custom_messages->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
              *)local_e8);
  (this->custom_message_)._M_dataplus._M_p = (pointer)&(this->custom_message_).field_2;
  (this->custom_message_)._M_string_length = 0;
  (this->custom_message_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit compilation_context(const uri_wrapper& retrieval_uri,
            const std::unordered_map<std::string,std::string>& custom_messages = std::unordered_map<std::string,std::string>{})
            : base_uri_(retrieval_uri), 
              uris_(std::vector<uri_wrapper>{{retrieval_uri}}),
              custom_messages_{custom_messages}
        {
        }